

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

void __thiscall
QRegularExpression::QRegularExpression
          (QRegularExpression *this,QString *pattern,PatternOptions options)

{
  QRegularExpressionPrivate *pQVar1;
  
  pQVar1 = (QRegularExpressionPrivate *)operator_new(0x48);
  pQVar1->compiledPattern = (pcre2_code_16 *)0x0;
  pQVar1->errorCode = 0;
  pQVar1->super_QSharedData = (QAtomicInt)0x0;
  pQVar1->patternOptions = (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)0x0;
  (pQVar1->pattern).d.d = (Data *)0x0;
  (pQVar1->pattern).d.ptr = (char16_t *)0x0;
  (pQVar1->pattern).d.size = 0;
  pQVar1->errorOffset = -1;
  pQVar1->capturingCount = 0;
  pQVar1->usingCrLfNewlines = false;
  pQVar1->isDirty = true;
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  QString::operator=(&((this->d).d.ptr)->pattern,pattern);
  (((this->d).d.ptr)->patternOptions).
  super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
  super_QFlagsStorage<QRegularExpression::PatternOption>.i =
       (Int)options.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
            super_QFlagsStorage<QRegularExpression::PatternOption>.i;
  return;
}

Assistant:

QRegularExpression::QRegularExpression(const QString &pattern, PatternOptions options)
    : d(new QRegularExpressionPrivate)
{
    d->pattern = pattern;
    d->patternOptions = options;
}